

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

void putcontig8bitCIELab16
               (TIFFRGBAImage *img,uint32_t *cp,uint32_t x,uint32_t y,uint32_t w,uint32_t h,
               int32_t fromskew,int32_t toskew,uchar *pp)

{
  uint32_t b;
  float Z;
  float X;
  float local_60;
  uint32_t local_5c;
  uint32_t local_58;
  uint32_t local_54;
  uint32_t local_50;
  uint local_4c;
  float local_48;
  float local_44;
  long local_40;
  long local_38;
  
  if (h != 0) {
    local_38 = (long)toskew;
    local_40 = (long)(fromskew * 3);
    local_58 = h;
    local_5c = w;
    do {
      for (; w != 0; w = w - 1) {
        TIFFCIELab16ToXYZ(img->cielab,(uint)*(ushort *)pp,(int)(short)*(ushort *)((long)pp + 2),
                          (int)(short)*(ushort *)((long)pp + 4),&local_44,&local_60,&local_48);
        TIFFXYZToRGB(img->cielab,local_44,local_60,local_48,&local_4c,&local_50,&local_54);
        *cp = local_50 << 8 | local_4c | local_54 << 0x10 | 0xff000000;
        cp = cp + 1;
        pp = (uchar *)((long)pp + 6);
      }
      cp = cp + local_38;
      pp = (uchar *)((long)pp + local_40 * 2);
      local_58 = local_58 - 1;
      w = local_5c;
    } while (local_58 != 0);
  }
  return;
}

Assistant:

DECLAREContigPutFunc(putcontig8bitCIELab16)
{
    float X, Y, Z;
    uint32_t r, g, b;
    uint16_t *wp = (uint16_t *)pp;
    (void)y;
    fromskew *= 3;
    for (; h > 0; --h)
    {
        for (x = w; x > 0; --x)
        {
            TIFFCIELab16ToXYZ(img->cielab, (uint16_t)wp[0], (int16_t)wp[1],
                              (int16_t)wp[2], &X, &Y, &Z);
            TIFFXYZToRGB(img->cielab, X, Y, Z, &r, &g, &b);
            *cp++ = PACK(r, g, b);
            wp += 3;
        }
        cp += toskew;
        wp += fromskew;
    }
}